

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void wallet::coinselector_tests::check_max_selection_weight_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffece8;
  std_string *in_stack_ffffffffffffecf0;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecf8;
  const_string *in_stack_ffffffffffffed10;
  size_t in_stack_ffffffffffffed18;
  undefined1 *__s;
  const_string *in_stack_ffffffffffffed20;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffed28;
  check_max_selection_weight *in_stack_ffffffffffffee50;
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_fa8 [408];
  undefined1 local_e10 [408];
  undefined1 local_c78 [408];
  check_max_selection_weight t;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [27])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  check_max_selection_weight::check_max_selection_weight
            ((check_max_selection_weight *)in_stack_ffffffffffffece8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_c78,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [27])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [16])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::setup_conditional<wallet::coinselector_tests::check_max_selection_weight>
            ((check_max_selection_weight *)0xd7355f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_e10,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [27])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [13])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  check_max_selection_weight::test_method(in_stack_ffffffffffffee50);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_fa8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [27])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [19])in_stack_ffffffffffffecf0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::teardown_conditional<wallet::coinselector_tests::check_max_selection_weight>
            ((check_max_selection_weight *)0xd7378b);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  __s = local_1140;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  msg = boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [27])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  check_max_selection_weight::~check_max_selection_weight
            ((check_max_selection_weight *)in_stack_ffffffffffffece8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_max_selection_weight)
{
    const CAmount target = 49.5L * COIN;
    CCoinControl cc;

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/68,
        /*min_change_target=*/CENT,
        /*effective_feerate=*/CFeeRate(0),
        /*long_term_feerate=*/CFeeRate(0),
        /*discard_feerate=*/CFeeRate(0),
        /*tx_noinputs_size=*/10 + 34, // static header size + output size
        /*avoid_partial=*/false,
    };

    int max_weight = MAX_STANDARD_TX_WEIGHT - WITNESS_SCALE_FACTOR * (cs_params.tx_noinputs_size + cs_params.change_output_size);
    {
        // Scenario 1:
        // The actor starts with 1x 50.0 BTC and 1515x 0.033 BTC (~100.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // The 50.0 BTC output should be selected, because the transaction would otherwise be too large

        // Perform selection

        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }

                add_coin(available_coins, wallet, CAmount(50 * COIN), CFeeRate(0), 144, false, 0, true);
                return available_coins;
            },
            m_node);

        BOOST_CHECK(result);
        // Verify that the 50 BTC UTXO was selected, and result is below max_weight
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(50 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 2:

        // The actor starts with 400x 0.0625 BTC and 2000x 0.025 BTC (75.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // A combination of coins should be selected, such that the created transaction is not too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 400; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.0625 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                for (int j = 0; j < 2000; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.025 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.0625 * COIN)));
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.025 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 3:

        // The actor starts with 1515x 0.033 BTC (49.995 BTC total) unspent outputs
        // No results should be returned, because the transaction would be too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        // No results
        // 1515 inputs * 68 bytes = 103,020 bytes
        // 103,020 bytes * 4 = 412,080 weight, which is above the MAX_STANDARD_TX_WEIGHT of 400,000
        BOOST_CHECK(!result);
    }
}